

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

void check_equal<booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,booster::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *a,sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   b)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff898;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8a0;
  string local_690 [32];
  ostringstream local_670 [383];
  undefined1 local_4f1;
  string local_4f0 [32];
  ostringstream local_4d0 [383];
  undefined1 local_351;
  string local_350 [32];
  ostringstream local_330 [383];
  undefined1 local_1b1;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  bVar1 = booster::operator==(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    poVar2 = std::operator<<((ostream *)local_180,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3f);
    std::operator<<(poVar2," a==b");
    local_1b1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1b0);
    local_1b1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator==(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_330);
    poVar2 = std::operator<<((ostream *)local_330,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x40);
    std::operator<<(poVar2," b==a");
    local_351 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_350);
    local_351 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator!=(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_4d0);
    poVar2 = std::operator<<((ostream *)local_4d0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x41);
    std::operator<<(poVar2," !(a!=b)");
    local_4f1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_4f0);
    local_4f1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::operator!=(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  if (!bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_670);
  poVar2 = std::operator<<((ostream *)local_670,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x42);
  std::operator<<(poVar2," !(b!=a)");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar3,local_690);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_equal(Match const &a,Other b)
{
	TEST(a==b);
	TEST(b==a);
	TEST(!(a!=b));
	TEST(!(b!=a));
}